

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O0

int SUNNonlinSolSolve_FixedPoint
              (SUNNonlinearSolver NLS,N_Vector y0,N_Vector y,N_Vector w,realtype tol,int callSetup,
              void *mem)

{
  N_Vector z;
  N_Vector gval;
  N_Vector z_00;
  int iVar1;
  N_Vector delta;
  N_Vector gy;
  N_Vector yprev;
  int retval;
  void *mem_local;
  int callSetup_local;
  realtype tol_local;
  N_Vector w_local;
  N_Vector y_local;
  N_Vector y0_local;
  SUNNonlinearSolver NLS_local;
  
  if ((((NLS == (SUNNonlinearSolver)0x0) || (y0 == (N_Vector)0x0)) || (y == (N_Vector)0x0)) ||
     ((w == (N_Vector)0x0 || (mem == (void *)0x0)))) {
    NLS_local._4_4_ = -1;
  }
  else {
    z = *(N_Vector *)((long)NLS->content + 0x58);
    gval = *(N_Vector *)((long)NLS->content + 0x60);
    z_00 = *(N_Vector *)((long)NLS->content + 0x78);
    N_VScale(1.0,y0,y);
    *(undefined4 *)((long)NLS->content + 0x80) = 0;
    while (*(int *)((long)NLS->content + 0x80) < *(int *)((long)NLS->content + 0x84)) {
      N_VScale(1.0,y,z);
      iVar1 = (**NLS->content)(y,gval,mem);
      if (iVar1 != 0) break;
      if (*(int *)((long)NLS->content + 0x10) == 0) {
        N_VScale(1.0,gval,y);
      }
      else {
        AndersonAccelerate(NLS,gval,y,z,*(int *)((long)NLS->content + 0x80));
      }
      *(long *)((long)NLS->content + 0x88) = *(long *)((long)NLS->content + 0x88) + 1;
      N_VLinearSum(1.0,y,-1.0,z,z_00);
      iVar1 = (**(code **)((long)NLS->content + 8))(tol,NLS,y,z_00,w,mem);
      if (iVar1 == 0) {
        return 0;
      }
      if (iVar1 != 1) {
        *(long *)((long)NLS->content + 0x90) = *(long *)((long)NLS->content + 0x90) + 1;
        return iVar1;
      }
      *(int *)((long)NLS->content + 0x80) = *(int *)((long)NLS->content + 0x80) + 1;
    }
    *(long *)((long)NLS->content + 0x90) = *(long *)((long)NLS->content + 0x90) + 1;
    NLS_local._4_4_ = 2;
  }
  return NLS_local._4_4_;
}

Assistant:

int SUNNonlinSolSolve_FixedPoint(SUNNonlinearSolver NLS, N_Vector y0,
                                 N_Vector y, N_Vector w, realtype tol,
                                 booleantype callSetup, void* mem)
{
  /* local variables */
  int retval;
  N_Vector yprev, gy, delta;

  /* check that the inputs are non-null */
  if ( (NLS == NULL) || (y0 == NULL) || (y == NULL) || (w == NULL) || (mem == NULL) )
    return(SUN_NLS_MEM_NULL);

  /* set local shortcut variables */
  yprev = FP_CONTENT(NLS)->yprev;
  gy    = FP_CONTENT(NLS)->gy;
  delta = FP_CONTENT(NLS)->delta;

  /* load prediction into y */
  N_VScale(ONE, y0, y);

  /* Looping point for attempts at solution of the nonlinear system:
       Evaluate fixed-point function (store in gy).
       Performs the accelerated fixed-point iteration.
       Performs stopping tests. */
  for( FP_CONTENT(NLS)->curiter = 0;
       FP_CONTENT(NLS)->curiter < FP_CONTENT(NLS)->maxiters;
       FP_CONTENT(NLS)->curiter++ ) {

    /* update previous solution guess */
    N_VScale(ONE, y, yprev);

    /* compute fixed-point iteration function, store in gy */
    retval = FP_CONTENT(NLS)->Sys(y, gy, mem);
    if (retval != SUN_NLS_SUCCESS) break;

    /* perform fixed point update, based on choice of acceleration or not */
    if (FP_CONTENT(NLS)->m == 0) {    /* basic fixed-point solver */
      N_VScale(ONE, gy, y);
    } else {                          /* Anderson-accelerated solver */
      retval = AndersonAccelerate(NLS, gy, y, yprev, FP_CONTENT(NLS)->curiter);
    }

    /* increment nonlinear solver iteration counter */
    FP_CONTENT(NLS)->niters++;

    /* compute change in solution, and call the convergence test function */
    N_VLinearSum(ONE, y, -ONE, yprev, delta);

    /* test for convergence */
    retval = FP_CONTENT(NLS)->CTest(NLS, y, delta, tol, w, mem);

    /* return if successful */
    if (retval == SUN_NLS_SUCCESS)  return(SUN_NLS_SUCCESS);

    /* check if the iterations should continue; otherwise increment the
       convergence failure count and return error flag */
    if (retval != SUN_NLS_CONTINUE) {
      FP_CONTENT(NLS)->nconvfails++;
      return(retval);
    }

  }

  /* if we've reached this point, then we exhausted the iteration limit;
     increment the convergence failure count and return */
  FP_CONTENT(NLS)->nconvfails++;
  return(SUN_NLS_CONV_RECVR);
}